

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O3

void __thiscall StatsByIP::Add(StatsByIP *this,StatsByIP *key)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  
  this->count = this->count + key->count;
  uVar5 = key->nb_edns;
  uVar6 = key->nb_not_qname_mini;
  uVar7 = key->nb_recursive_queries;
  this->nb_do = this->nb_do + key->nb_do;
  this->nb_edns = this->nb_edns + uVar5;
  this->nb_not_qname_mini = this->nb_not_qname_mini + uVar6;
  this->nb_recursive_queries = this->nb_recursive_queries + uVar7;
  uVar1 = key->nb_tcp_443;
  uVar3 = key->nb_tcp_583;
  uVar2 = this->nb_tcp_443;
  uVar4 = this->nb_tcp_583;
  this->nb_tcp_443 = uVar2 + uVar1;
  this->nb_tcp_583 = uVar4 + uVar3;
  this->query_seen = (bool)(this->query_seen | key->query_seen);
  this->response_seen = (bool)(this->response_seen | key->response_seen);
  this->option_mask = this->option_mask | key->option_mask;
  return;
}

Assistant:

void StatsByIP::Add(StatsByIP * key)
{
    count += key->count;
    nb_do += key->nb_do;
    nb_edns += key->nb_edns;
    nb_not_qname_mini += key->nb_not_qname_mini;
    nb_recursive_queries += key->nb_recursive_queries;
    nb_tcp_443 += key->nb_tcp_443;
    nb_tcp_583 += key->nb_tcp_583;
    query_seen |= key->query_seen;
    response_seen |= key->response_seen;
    option_mask |= key->option_mask;
}